

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O2

ssize_t __thiscall LASindex::write(LASindex *this,int __fd,void *__buf,size_t __n)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  FILE *__stream;
  ssize_t sVar4;
  void *__buf_00;
  char cVar5;
  undefined8 unaff_RBP;
  ulong uVar6;
  undefined4 in_register_00000034;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  if (pcVar2 == (char *)0x0) {
    uVar6 = 0;
    goto LAB_001239a8;
  }
  __s = strdup(pcVar2);
  pcVar1 = strstr(pcVar2,".las");
  cVar5 = 'x';
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strstr(pcVar2,".laz");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strstr(pcVar2,".LAS");
      cVar5 = 'X';
      if (pcVar1 == (char *)0x0) {
        pcVar2 = strstr(pcVar2,".LAZ");
        if (pcVar2 == (char *)0x0) {
          sVar3 = strlen(__s);
          __s[sVar3 - 3] = 'l';
          sVar3 = strlen(__s);
          __s[sVar3 - 2] = 'a';
          cVar5 = 'x';
        }
      }
    }
  }
  sVar3 = strlen(__s);
  __s[sVar3 - 1] = cVar5;
  __stream = (FILE *)LASfopen(__s,"wb");
  if (__stream == (FILE *)0x0) {
    laserror<char*>("(LASindex): cannot open file \'%s\' for write",__s);
LAB_0012399e:
    uVar6 = 0;
  }
  else {
    sVar4 = write(this,(int)__stream,__buf_00,__n);
    if ((char)sVar4 == '\0') {
      laserror<char*>("(LASindex): cannot write file \'%s\'",__s);
      fclose(__stream);
      goto LAB_0012399e;
    }
    fclose(__stream);
    uVar6 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  free(__s);
LAB_001239a8:
  return uVar6 & 0xffffffff;
}

Assistant:

BOOL LASindex::write(const char* file_name) const
{
  if (file_name == 0) return FALSE;
  char* name = LASCopyString(file_name);
  if (strstr(file_name, ".las") || strstr(file_name, ".laz"))
  {
    name[strlen(name)-1] = 'x';
  }
  else if (strstr(file_name, ".LAS") || strstr(file_name, ".LAZ"))
  {
    name[strlen(name)-1] = 'X';
  }
  else
  {
    name[strlen(name)-3] = 'l';
    name[strlen(name)-2] = 'a';
    name[strlen(name)-1] = 'x';
  }
  FILE* file = LASfopen(name, "wb");

  if (file == 0)
  {
    laserror("(LASindex): cannot open file '%s' for write", name);
    free(name);
    return FALSE;
  }
  if (!write(file))
  {
    laserror("(LASindex): cannot write file '%s'", name);
    fclose(file);
    free(name);
    return FALSE;
  }
  fclose(file);
  free(name);
  return TRUE;
}